

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::ArrayComprehension::ArrayComprehension
          (ArrayComprehension *this,LocationRange *lr,Fodder *open_fodder,AST *body,
          Fodder *comma_fodder,bool trailing_comma,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs,Fodder *close_fodder)

{
  AST::AST(&this->super_AST,lr,AST_ARRAY_COMPREHENSION,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__ArrayComprehension_00199a70;
  this->body = body;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->commaFodder,comma_fodder);
  this->trailingComma = trailing_comma;
  std::
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ::vector(&this->specs,specs);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->closeFodder,close_fodder);
  if ((specs->
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (specs->
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    return;
  }
  __assert_fail("specs.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                0x10b,
                "jsonnet::internal::ArrayComprehension::ArrayComprehension(const LocationRange &, const Fodder &, AST *, const Fodder &, bool, const std::vector<ComprehensionSpec> &, const Fodder &)"
               );
}

Assistant:

ArrayComprehension(const LocationRange &lr, const Fodder &open_fodder, AST *body,
                       const Fodder &comma_fodder, bool trailing_comma,
                       const std::vector<ComprehensionSpec> &specs, const Fodder &close_fodder)
        : AST(lr, AST_ARRAY_COMPREHENSION, open_fodder),
          body(body),
          commaFodder(comma_fodder),
          trailingComma(trailing_comma),
          specs(specs),
          closeFodder(close_fodder)
    {
        assert(specs.size() > 0);
    }